

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_3_2::DwaCompressor::compress(DwaCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  Box<Imath_3_2::Vec2<int>_> *in_RSI;
  Vec2<int> *in_RDI;
  char **in_stack_00000920;
  Box2i *in_stack_00000928;
  int in_stack_00000934;
  char *in_stack_00000938;
  DwaCompressor *in_stack_00000940;
  Vec2<int> local_40;
  Vec2<int> local_38 [4];
  int local_18;
  
  local_18 = in_ECX;
  Imath_3_2::Vec2<int>::Vec2(local_38,in_RDI[3].y,in_ECX);
  iVar2 = in_RDI[4].y;
  iVar1 = (**(code **)((long)*in_RDI + 0x10))();
  Imath_3_2::Vec2<int>::Vec2(&local_40,iVar2,local_18 + iVar1 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_RSI,in_RDI,(Vec2<int> *)CONCAT44(iVar2,local_18));
  iVar2 = compress(in_stack_00000940,in_stack_00000938,in_stack_00000934,in_stack_00000928,
                   in_stack_00000920);
  return iVar2;
}

Assistant:

int
DwaCompressor::compress (
    const char* inPtr, int inSize, int minY, const char*& outPtr)
{
    return compress (
        inPtr,
        inSize,
        IMATH_NAMESPACE::Box2i (
            IMATH_NAMESPACE::V2i (_min[0], minY),
            IMATH_NAMESPACE::V2i (_max[0], minY + numScanLines () - 1)),
        outPtr);
}